

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::ChannelsSetCurrent(ImDrawList *this,int idx)

{
  ImDrawChannel *pIVar1;
  ImVector<unsigned_short> *pIVar2;
  ImDrawChannel *pIVar3;
  ImDrawCmd *pIVar4;
  unsigned_short *puVar5;
  int iVar6;
  
  if (this->_ChannelsCurrent != idx) {
    iVar6 = (this->CmdBuffer).Capacity;
    pIVar4 = (this->CmdBuffer).Data;
    pIVar1 = (this->_Channels).Data + this->_ChannelsCurrent;
    (pIVar1->CmdBuffer).Size = (this->CmdBuffer).Size;
    (pIVar1->CmdBuffer).Capacity = iVar6;
    (pIVar1->CmdBuffer).Data = pIVar4;
    iVar6 = (this->IdxBuffer).Capacity;
    puVar5 = (this->IdxBuffer).Data;
    pIVar2 = &(this->_Channels).Data[this->_ChannelsCurrent].IdxBuffer;
    pIVar2->Size = (this->IdxBuffer).Size;
    pIVar2->Capacity = iVar6;
    pIVar2->Data = puVar5;
    this->_ChannelsCurrent = idx;
    pIVar3 = (this->_Channels).Data;
    pIVar1 = pIVar3 + idx;
    iVar6 = (pIVar1->CmdBuffer).Capacity;
    pIVar4 = (pIVar1->CmdBuffer).Data;
    (this->CmdBuffer).Size = (pIVar1->CmdBuffer).Size;
    (this->CmdBuffer).Capacity = iVar6;
    (this->CmdBuffer).Data = pIVar4;
    pIVar2 = &pIVar3[idx].IdxBuffer;
    iVar6 = pIVar2->Capacity;
    puVar5 = pIVar2->Data;
    (this->IdxBuffer).Size = pIVar2->Size;
    (this->IdxBuffer).Capacity = iVar6;
    (this->IdxBuffer).Data = puVar5;
    this->_IdxWritePtr = (this->IdxBuffer).Data + (this->IdxBuffer).Size;
  }
  return;
}

Assistant:

void ImDrawList::ChannelsSetCurrent(int idx)
{
    IM_ASSERT(idx < _ChannelsCount);
    if (_ChannelsCurrent == idx) return;
    memcpy(&_Channels.Data[_ChannelsCurrent].CmdBuffer, &CmdBuffer, sizeof(CmdBuffer)); // copy 12 bytes, four times
    memcpy(&_Channels.Data[_ChannelsCurrent].IdxBuffer, &IdxBuffer, sizeof(IdxBuffer));
    _ChannelsCurrent = idx;
    memcpy(&CmdBuffer, &_Channels.Data[_ChannelsCurrent].CmdBuffer, sizeof(CmdBuffer));
    memcpy(&IdxBuffer, &_Channels.Data[_ChannelsCurrent].IdxBuffer, sizeof(IdxBuffer));
    _IdxWritePtr = IdxBuffer.Data + IdxBuffer.Size;
}